

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_cbegin_cend_forward_Test::TestBody
          (IntrusiveListIteratorTest_cbegin_cend_forward_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator<int> local_bd;
  int local_bc [3];
  iterator local_b0;
  size_type local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  const_iterator local_88;
  const_iterator local_78;
  allocator<int> local_65;
  int local_64 [3];
  iterator local_58;
  size_type local_50;
  vector<int,_std::allocator<int>_> local_48;
  const_iterator local_30;
  const_iterator local_20;
  IntrusiveListIteratorTest_cbegin_cend_forward_Test *local_10;
  IntrusiveListIteratorTest_cbegin_cend_forward_Test *this_local;
  
  local_10 = this;
  local_20 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::cbegin
                       (&(this->super_IntrusiveListIteratorTest).list_);
  local_30 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::cend
                       (&(this->super_IntrusiveListIteratorTest).list_);
  local_64[0] = 1;
  local_64[1] = 2;
  local_64[2] = 3;
  local_58 = local_64;
  local_50 = 3;
  std::allocator<int>::allocator(&local_65);
  __l_00._M_len = local_50;
  __l_00._M_array = local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l_00,&local_65);
  anon_unknown.dwarf_4f553::IntrusiveListIteratorTest::
  TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (&this->super_IntrusiveListIteratorTest,local_20,local_30,&local_48);
  std::vector<int,_std::allocator<int>_>::~vector(&local_48);
  std::allocator<int>::~allocator(&local_65);
  local_78 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::cbegin
                       ((this->super_IntrusiveListIteratorTest).clist_);
  local_88 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::cend
                       ((this->super_IntrusiveListIteratorTest).clist_);
  local_bc[0] = 1;
  local_bc[1] = 2;
  local_bc[2] = 3;
  local_b0 = local_bc;
  local_a8 = 3;
  std::allocator<int>::allocator(&local_bd);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_bd);
  anon_unknown.dwarf_4f553::IntrusiveListIteratorTest::
  TestForward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (&this->super_IntrusiveListIteratorTest,local_78,local_88,&local_a0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a0);
  std::allocator<int>::~allocator(&local_bd);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, cbegin_cend_forward) {
  TestForward(list_.cbegin(), list_.cend(), {1, 2, 3});
  TestForward(clist_.cbegin(), clist_.cend(), {1, 2, 3});
}